

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_D3D_TEXLD(Context *ctx)

{
  uint32 uVar1;
  byte bVar2;
  
  if (ctx->major_ver < 2) {
    bVar2 = 0;
    if (ctx->minor_ver != 0xff) {
      bVar2 = ctx->minor_ver;
    }
    if (((uint)bVar2 | (uint)ctx->major_ver << 0x10) < 0x10004) {
      emit_D3D_opcode_d(ctx,"tex");
      return;
    }
    emit_D3D_opcode_ds(ctx,"texld");
    return;
  }
  uVar1 = ctx->instruction_controls;
  if (uVar1 == 2) {
    emit_D3D_opcode_dss(ctx,"texldb");
    return;
  }
  if (uVar1 != 1) {
    if (uVar1 == 0) {
      emit_D3D_opcode_dss(ctx,"texld");
      return;
    }
    return;
  }
  emit_D3D_opcode_dss(ctx,"texldp");
  return;
}

Assistant:

static void emit_D3D_TEXLD(Context *ctx)
{
    // this opcode looks and acts differently depending on the shader model.
    if (shader_version_atleast(ctx, 2, 0))
    {
        if (ctx->instruction_controls == CONTROL_TEXLD)
           emit_D3D_opcode_dss(ctx, "texld");
        else if (ctx->instruction_controls == CONTROL_TEXLDP)
           emit_D3D_opcode_dss(ctx, "texldp");
        else if (ctx->instruction_controls == CONTROL_TEXLDB)
           emit_D3D_opcode_dss(ctx, "texldb");
    } // if

    else if (shader_version_atleast(ctx, 1, 4))
    {
        emit_D3D_opcode_ds(ctx, "texld");
    } // else if

    else
    {
        emit_D3D_opcode_d(ctx, "tex");
    } // else
}